

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupDemiterOrderXors2(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *vSizes;
  int *pPerm;
  int iObj;
  int i;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  _iObj = vXors;
  vXors_local = (Vec_Int_t *)p;
  p_00 = Vec_IntAlloc(100);
  for (pPerm._4_4_ = 0; iVar2 = pPerm._4_4_, iVar1 = Vec_IntSize(_iObj), iVar2 < iVar1;
      pPerm._4_4_ = pPerm._4_4_ + 1) {
    pPerm._0_4_ = Vec_IntEntry(_iObj,pPerm._4_4_);
    iVar2 = Gia_ManSuppSize((Gia_Man_t *)vXors_local,(int *)&pPerm,1);
    Vec_IntPush(p_00,iVar2);
  }
  piVar3 = Vec_IntArray(p_00);
  iVar2 = Vec_IntSize(p_00);
  piVar3 = Abc_MergeSortCost(piVar3,iVar2);
  Vec_IntClear(p_00);
  for (pPerm._4_4_ = 0; iVar2 = pPerm._4_4_, iVar1 = Vec_IntSize(_iObj), iVar2 < iVar1;
      pPerm._4_4_ = pPerm._4_4_ + 1) {
    iVar2 = Vec_IntEntry(_iObj,piVar3[pPerm._4_4_]);
    Vec_IntPush(p_00,iVar2);
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  Vec_IntClear(_iObj);
  Vec_IntAppend(_iObj,p_00);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManDupDemiterOrderXors2( Gia_Man_t * p, Vec_Int_t * vXors )
{
    int i, iObj, * pPerm;
    Vec_Int_t * vSizes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vXors, iObj, i )
        Vec_IntPush( vSizes, Gia_ManSuppSize(p, &iObj, 1) );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vSizes), Vec_IntSize(vSizes) );
    Vec_IntClear( vSizes );
    for ( i = 0; i < Vec_IntSize(vXors); i++ )
        Vec_IntPush( vSizes, Vec_IntEntry(vXors, pPerm[i]) );
    ABC_FREE( pPerm );
    Vec_IntClear( vXors );
    Vec_IntAppend( vXors, vSizes );
    Vec_IntFree( vSizes );
}